

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::TextureCubeArrayView::sampleCompare
          (TextureCubeArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float q,
          float lod)

{
  FilterMode FVar1;
  undefined8 uVar2;
  TextureFormat TVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ConstPixelBufferAccess *pCVar11;
  int i_1;
  CubeFace face;
  long lVar12;
  ConstPixelBufferAccess *pCVar13;
  ConstPixelBufferAccess *level_1;
  int i;
  int iVar14;
  ConstPixelBufferAccess *level;
  float t_00;
  float fVar15;
  float fVar16;
  CubeFaceFloatCoords CVar17;
  float local_24c;
  ConstPixelBufferAccess local_240;
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess faceAccesses1 [6];
  
  pCVar11 = faceAccesses;
  faceAccesses[0].m_format.type = (ChannelType)t;
  faceAccesses[0].m_format.order = (ChannelOrder)s;
  faceAccesses[0].m_size.m_data[0] = (int)r;
  CVar17 = getCubeFaceCoords((Vec3 *)pCVar11);
  t_00 = CVar17.t;
  fVar16 = CVar17.s;
  fVar15 = floorf(q + 0.5);
  iVar5 = (int)fVar15;
  iVar7 = (this->m_levels->m_size).m_data[2] / 6 + -1;
  if (iVar5 < iVar7) {
    iVar7 = iVar5;
  }
  iVar14 = 0;
  if (-1 < iVar5) {
    iVar14 = iVar7;
  }
  face = CVar17.face;
  iVar7 = getCubeArrayFaceIndex(face);
  if (sampler->seamlessCubeMap != true) {
    faceAccesses[0].m_format.order = R;
    faceAccesses[0].m_format.type = SNORM_INT8;
    faceAccesses[0].m_size.m_data[0] = iVar7 + iVar14 * 6;
    fVar16 = sampleLevelArray2DCompare
                       (this->m_levels,this->m_numLevels,sampler,ref,fVar16,t_00,lod,
                        (IVec3 *)faceAccesses);
    return fVar16;
  }
  pCVar13 = this->m_levels;
  iVar7 = this->m_numLevels;
  iVar5 = getCubeArrayFaceIndex(face);
  FVar1 = (&sampler->minFilter)[lod <= sampler->lodThreshold];
  if (LINEAR_MIPMAP_LINEAR < FVar1) {
    return 0.0;
  }
  iVar14 = iVar14 * 6;
  iVar5 = iVar5 + iVar14;
  switch(FVar1) {
  case NEAREST:
    faceAccesses[0].m_size.m_data[0] = sampler->wrapR;
    faceAccesses[0].m_size.m_data[1] = sampler->minFilter;
    faceAccesses[0].m_size.m_data[2] = sampler->magFilter;
    faceAccesses[0].m_pitch.m_data[0] = (int)sampler->lodThreshold;
    faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)&sampler->normalizedCoords;
    faceAccesses[0].m_data = *(void **)&sampler->compareChannel;
    uVar2 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
    faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
    faceAccesses[1].m_size.m_data[0] =
         (int)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
    faceAccesses[1].m_format.order = (ChannelOrder)uVar2;
    faceAccesses[1].m_format.type = (ChannelType)((ulong)uVar2 >> 0x20);
    break;
  case LINEAR:
    lVar10 = 8;
    do {
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -0x10) = 0x2600000015;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -8) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + 8) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar10 + 4) = 0;
      lVar10 = lVar10 + 0x28;
    } while (lVar10 != 0xf8);
    pCVar11 = faceAccesses;
    lVar10 = 0;
    do {
      iVar7 = getCubeArrayFaceIndex((CubeFace)lVar10);
      getSubregion(faceAccesses1,pCVar13,0,0,iVar7 + iVar14,(pCVar13->m_size).m_data[0],
                   (pCVar13->m_size).m_data[1],1);
      pCVar11->m_data = faceAccesses1[0].m_data;
      uVar4 = faceAccesses1[0].m_pitch.m_data._4_8_;
      TVar3 = faceAccesses1[0].m_format;
      uVar2 = CONCAT44(faceAccesses1[0].m_size.m_data[1],faceAccesses1[0].m_size.m_data[0]);
      *(undefined8 *)((pCVar11->m_size).m_data + 2) = faceAccesses1[0]._16_8_;
      *(undefined8 *)((pCVar11->m_pitch).m_data + 1) = uVar4;
      pCVar11->m_format = TVar3;
      *(undefined8 *)(pCVar11->m_size).m_data = uVar2;
      lVar10 = lVar10 + 1;
      pCVar11 = pCVar11 + 1;
    } while (lVar10 != 6);
LAB_00aae4b4:
    fVar16 = sampleCubeSeamlessLinearCompare(&faceAccesses,face,sampler,ref,fVar16,t_00);
    return fVar16;
  default:
    iVar7 = iVar7 + -1;
    fVar15 = ceilf(lod + 0.5);
    iVar8 = (int)fVar15 + -1;
    if (iVar8 < iVar7) {
      iVar7 = iVar8;
    }
    iVar9 = 0;
    if (-1 < iVar8) {
      iVar9 = iVar7;
    }
    if (FVar1 == LINEAR_MIPMAP_NEAREST) {
      lVar10 = 8;
      do {
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -0x10) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + 8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar10 + 4) = 0;
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xf8);
      pCVar13 = pCVar13 + iVar9;
      lVar10 = 0;
      do {
        iVar7 = getCubeArrayFaceIndex((CubeFace)lVar10);
        getSubregion(faceAccesses1,pCVar13,0,0,iVar7 + iVar14,(pCVar13->m_size).m_data[0],
                     (pCVar13->m_size).m_data[1],1);
        pCVar11->m_data = faceAccesses1[0].m_data;
        uVar4 = faceAccesses1[0].m_pitch.m_data._4_8_;
        TVar3 = faceAccesses1[0].m_format;
        uVar2 = CONCAT44(faceAccesses1[0].m_size.m_data[1],faceAccesses1[0].m_size.m_data[0]);
        *(undefined8 *)((pCVar11->m_size).m_data + 2) = faceAccesses1[0]._16_8_;
        *(undefined8 *)((pCVar11->m_pitch).m_data + 1) = uVar4;
        pCVar11->m_format = TVar3;
        *(undefined8 *)(pCVar11->m_size).m_data = uVar2;
        lVar10 = lVar10 + 1;
        pCVar11 = pCVar11 + 1;
      } while (lVar10 != 6);
      goto LAB_00aae4b4;
    }
    pCVar13 = pCVar13 + iVar9;
    faceAccesses[0].m_size.m_data[0] = sampler->wrapR;
    faceAccesses[0].m_size.m_data[1] = sampler->minFilter;
    faceAccesses[0].m_size.m_data[2] = sampler->magFilter;
    faceAccesses[0].m_pitch.m_data[0] = (int)sampler->lodThreshold;
    faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)&sampler->normalizedCoords;
    faceAccesses[0].m_data = *(void **)&sampler->compareChannel;
    uVar2 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
    faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
    faceAccesses[1].m_size.m_data[0] =
         (int)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
    faceAccesses[1].m_format.order = (ChannelOrder)uVar2;
    faceAccesses[1].m_format.type = (ChannelType)((ulong)uVar2 >> 0x20);
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    iVar7 = iVar7 + -1;
    fVar15 = floorf(lod);
    iVar9 = (int)fVar15;
    iVar8 = iVar7;
    if (iVar9 < iVar7) {
      iVar8 = iVar9;
    }
    iVar6 = 0;
    if (-1 < iVar9) {
      iVar6 = iVar8;
    }
    if (iVar6 + 1 <= iVar7) {
      iVar7 = iVar6 + 1;
    }
    if (FVar1 == LINEAR_MIPMAP_LINEAR) {
      lVar10 = 8;
      do {
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -0x10) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + -8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + 8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar10 + 4) = 0;
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xf8);
      lVar10 = 8;
      do {
        *(undefined8 *)((long)(&faceAccesses[5].m_pitch + 1) + lVar10) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar10 + -8) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar10) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar10 + 8) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_pitch.m_data + lVar10 + 4) = 0;
        lVar10 = lVar10 + 0x28;
      } while (lVar10 != 0xf8);
      pCVar11 = pCVar13 + iVar6;
      pCVar13 = pCVar13 + iVar7;
      lVar10 = 0;
      lVar12 = 0;
      do {
        iVar7 = getCubeArrayFaceIndex((CubeFace)lVar12);
        getSubregion(&local_240,pCVar11,0,0,iVar7 + iVar14,(pCVar11->m_size).m_data[0],
                     (pCVar11->m_size).m_data[1],1);
        *(void **)((long)(&faceAccesses[0].m_pitch + 1) + lVar10) = local_240.m_data;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10 + 8) = local_240._16_8_;
        *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar10 + 4) =
             local_240.m_pitch.m_data._4_8_;
        *(TextureFormat *)((long)faceAccesses[0].m_size.m_data + lVar10 + -8) = local_240.m_format;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar10) =
             local_240.m_size.m_data._0_8_;
        iVar7 = getCubeArrayFaceIndex((CubeFace)lVar12);
        getSubregion(&local_240,pCVar13,0,0,iVar7 + iVar14,(pCVar13->m_size).m_data[0],
                     (pCVar13->m_size).m_data[1],1);
        *(void **)((long)(&faceAccesses1[0].m_pitch + 1) + lVar10) = local_240.m_data;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar10 + 8) = local_240._16_8_;
        *(undefined8 *)((long)faceAccesses1[0].m_pitch.m_data + lVar10 + 4) =
             local_240.m_pitch.m_data._4_8_;
        *(TextureFormat *)((long)faceAccesses1[0].m_size.m_data + lVar10 + -8) = local_240.m_format;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar10) =
             local_240.m_size.m_data._0_8_;
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0x28;
      } while (lVar12 != 6);
      local_24c = sampleCubeSeamlessLinearCompare(&faceAccesses,face,sampler,ref,fVar16,t_00);
      fVar16 = sampleCubeSeamlessLinearCompare(&faceAccesses1,face,sampler,ref,fVar16,t_00);
    }
    else {
      faceAccesses[0].m_size.m_data[0] = sampler->wrapR;
      faceAccesses[0].m_size.m_data[1] = sampler->minFilter;
      faceAccesses[0].m_size.m_data[2] = sampler->magFilter;
      faceAccesses[0].m_pitch.m_data[0] = (int)sampler->lodThreshold;
      faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)&sampler->normalizedCoords;
      faceAccesses[0].m_data = *(void **)&sampler->compareChannel;
      uVar2 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
      faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
      faceAccesses[1].m_size.m_data[0] =
           (int)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
      faceAccesses[1].m_format.order = (ChannelOrder)uVar2;
      faceAccesses[1].m_format.type = (ChannelType)((ulong)uVar2 >> 0x20);
      faceAccesses[0].m_format.order = R;
      faceAccesses[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_format.order = R;
      faceAccesses1[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_size.m_data[0] = iVar5;
      local_24c = ConstPixelBufferAccess::sample2DCompare
                            (pCVar13 + iVar6,(Sampler *)faceAccesses,NEAREST,ref,fVar16,t_00,
                             (IVec3 *)faceAccesses1);
      faceAccesses[0].m_size.m_data[0] = sampler->wrapR;
      faceAccesses[0].m_size.m_data[1] = sampler->minFilter;
      faceAccesses[0].m_size.m_data[2] = sampler->magFilter;
      faceAccesses[0].m_pitch.m_data[0] = (int)sampler->lodThreshold;
      faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)&sampler->normalizedCoords;
      faceAccesses[0].m_data = *(void **)&sampler->compareChannel;
      uVar2 = *(undefined8 *)((long)&(sampler->borderColor).v + 4);
      faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)&sampler->seamlessCubeMap;
      faceAccesses[1].m_size.m_data[0] =
           (int)((ulong)*(undefined8 *)((long)&(sampler->borderColor).v + 8) >> 0x20);
      faceAccesses[1].m_format.order = (ChannelOrder)uVar2;
      faceAccesses[1].m_format.type = (ChannelType)((ulong)uVar2 >> 0x20);
      faceAccesses[0].m_format.order = R;
      faceAccesses[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_format.order = R;
      faceAccesses1[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_size.m_data[0] = iVar5;
      fVar16 = ConstPixelBufferAccess::sample2DCompare
                         (pCVar13 + iVar7,(Sampler *)faceAccesses,NEAREST,ref,fVar16,t_00,
                          (IVec3 *)faceAccesses1);
    }
    return fVar16 * (lod - fVar15) + (1.0 - (lod - fVar15)) * local_24c;
  }
  faceAccesses1[0].m_format.order = R;
  faceAccesses1[0].m_format.type = SNORM_INT8;
  faceAccesses[0].m_format.order = R;
  faceAccesses[0].m_format.type = SNORM_INT8;
  faceAccesses1[0].m_size.m_data[0] = iVar5;
  fVar16 = ConstPixelBufferAccess::sample2DCompare
                     (pCVar13,(Sampler *)faceAccesses,NEAREST,ref,fVar16,t_00,(IVec3 *)faceAccesses1
                     );
  return fVar16;
}

Assistant:

float TextureCubeArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamlessCompare(m_levels, m_numLevels, layer, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, faceDepth));
}